

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  Bitmask BVar1;
  char *in_RSI;
  WhereMaskSet *in_RDI;
  Expr *in_stack_fffffffffffffff8;
  
  if ((*in_RSI == -0x58) && ((*(uint *)(in_RSI + 4) & 0x20) == 0)) {
    BVar1 = sqlite3WhereGetMask(in_RDI,*(int *)(in_RSI + 0x2c));
  }
  else if ((*(uint *)(in_RSI + 4) & 0x810000) == 0) {
    BVar1 = sqlite3WhereExprUsageFull((WhereMaskSet *)p,in_stack_fffffffffffffff8);
  }
  else {
    BVar1 = 0;
  }
  return BVar1;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  return sqlite3WhereExprUsageFull(pMaskSet, p);
}